

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopfilter_avx2.c
# Opt level: O1

void aom_lpf_horizontal_14_quad_avx2(uchar *s,int p,uchar *_blimit0,uchar *_limit0,uchar *_thresh0)

{
  uchar uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [32];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [32];
  undefined1 auVar54 [16];
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 uStack_1c0;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_118;
  undefined8 uStack_110;
  
  lVar18 = (long)p;
  auVar2 = *(undefined1 (*) [16])(s + lVar18 * -4);
  auVar39._16_16_ = auVar2;
  auVar39._0_16_ = auVar2;
  auVar51 = *(undefined1 (*) [16])(s + lVar18 * -3);
  auVar29._16_16_ = auVar51;
  auVar29._0_16_ = auVar51;
  lVar17 = lVar18 * 2;
  auVar3 = *(undefined1 (*) [16])(s + lVar18 * -2);
  auVar27._16_16_ = auVar3;
  auVar27._0_16_ = auVar3;
  auVar4 = *(undefined1 (*) [16])(s + -lVar18);
  auVar30._16_16_ = auVar4;
  auVar30._0_16_ = auVar4;
  auVar38 = *(undefined1 (*) [16])s;
  auVar31._16_16_ = auVar38;
  auVar31._0_16_ = auVar38;
  auVar5 = *(undefined1 (*) [16])(s + lVar18);
  auVar33._16_16_ = auVar5;
  auVar33._0_16_ = auVar5;
  auVar42 = *(undefined1 (*) [16])(s + lVar18 * 2);
  auVar34._16_16_ = auVar42;
  auVar34._0_16_ = auVar42;
  auVar41 = *(undefined1 (*) [16])(s + lVar18 * 3);
  auVar43._16_16_ = auVar41;
  auVar43._0_16_ = auVar41;
  uVar1 = *_limit0;
  auVar21[1] = uVar1;
  auVar21[0] = uVar1;
  auVar21[2] = uVar1;
  auVar21[3] = uVar1;
  auVar21[4] = uVar1;
  auVar21[5] = uVar1;
  auVar21[6] = uVar1;
  auVar21[7] = uVar1;
  auVar21[8] = uVar1;
  auVar21[9] = uVar1;
  auVar21[10] = uVar1;
  auVar21[0xb] = uVar1;
  auVar21[0xc] = uVar1;
  auVar21[0xd] = uVar1;
  auVar21[0xe] = uVar1;
  auVar21[0xf] = uVar1;
  uVar1 = *_blimit0;
  auVar46[1] = uVar1;
  auVar46[0] = uVar1;
  auVar46[2] = uVar1;
  auVar46[3] = uVar1;
  auVar46[4] = uVar1;
  auVar46[5] = uVar1;
  auVar46[6] = uVar1;
  auVar46[7] = uVar1;
  auVar46[8] = uVar1;
  auVar46[9] = uVar1;
  auVar46[10] = uVar1;
  auVar46[0xb] = uVar1;
  auVar46[0xc] = uVar1;
  auVar46[0xd] = uVar1;
  auVar46[0xe] = uVar1;
  auVar46[0xf] = uVar1;
  auVar6 = vpsubusb_avx(auVar3,auVar4);
  auVar49 = vpsubusb_avx(auVar4,auVar3);
  auVar6 = vpor_avx(auVar6,auVar49);
  auVar49 = vpsubusb_avx(auVar5,auVar38);
  auVar7 = vpsubusb_avx(auVar38,auVar5);
  auVar49 = vpor_avx(auVar49,auVar7);
  auVar7 = vpmaxub_avx(auVar6,auVar49);
  auVar6 = vpsubusb_avx(auVar4,auVar38);
  auVar49 = vpsubusb_avx(auVar38,auVar4);
  auVar6 = vpor_avx(auVar6,auVar49);
  auVar49 = vpsubusb_avx(auVar3,auVar5);
  auVar50 = vpsubusb_avx(auVar5,auVar3);
  auVar49 = vpor_avx(auVar49,auVar50);
  auVar6 = vpaddusb_avx(auVar6,auVar6);
  auVar50[8] = 0x7f;
  auVar50._0_8_ = 0x7f7f7f7f7f7f7f7f;
  auVar50[9] = 0x7f;
  auVar50[10] = 0x7f;
  auVar50[0xb] = 0x7f;
  auVar50[0xc] = 0x7f;
  auVar50[0xd] = 0x7f;
  auVar50[0xe] = 0x7f;
  auVar50[0xf] = 0x7f;
  auVar49 = vpsrlw_avx(auVar49,1);
  auVar49 = vpand_avx(auVar49,auVar50);
  auVar6 = vpaddusb_avx(auVar6,auVar49);
  auVar49 = vpminub_avx(auVar6,auVar46);
  auVar49 = vpcmpeqb_avx(auVar6,auVar49);
  auVar6 = vpcmpeqd_avx(auVar6,auVar6);
  auVar6 = vpmaxub_avx(auVar7,auVar49 ^ auVar6);
  auVar49 = vpsubusb_avx(auVar51,auVar3);
  auVar50 = vpsubusb_avx(auVar3,auVar51);
  auVar49 = vpor_avx(auVar49,auVar50);
  auVar50 = vpsubusb_avx(auVar2,auVar51);
  auVar2 = vpsubusb_avx(auVar51,auVar2);
  auVar2 = vpor_avx(auVar50,auVar2);
  auVar2 = vpmaxub_avx(auVar49,auVar2);
  auVar2 = vpmaxub_avx(auVar2,auVar6);
  auVar51 = vpsubusb_avx(auVar42,auVar5);
  auVar6 = vpsubusb_avx(auVar5,auVar42);
  auVar51 = vpor_avx(auVar51,auVar6);
  auVar6 = vpsubusb_avx(auVar41,auVar42);
  auVar42 = vpsubusb_avx(auVar42,auVar41);
  auVar42 = vpor_avx(auVar6,auVar42);
  auVar51 = vpmaxub_avx(auVar51,auVar42);
  auVar2 = vpmaxub_avx(auVar51,auVar2);
  auVar51 = vpminub_avx(auVar2,auVar21);
  auVar2 = vpcmpeqb_avx(auVar2,auVar51);
  if ((((((((((((((((auVar2 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar2 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar2 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar2 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar2 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar2 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar2 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar2 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar2 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar2 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar2 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (auVar2 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar2 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
       (auVar2 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar2 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar2[0xf] < '\0') {
    uVar1 = *_thresh0;
    auVar51[1] = uVar1;
    auVar51[0] = uVar1;
    auVar51[2] = uVar1;
    auVar51[3] = uVar1;
    auVar51[4] = uVar1;
    auVar51[5] = uVar1;
    auVar51[6] = uVar1;
    auVar51[7] = uVar1;
    auVar51[8] = uVar1;
    auVar51[9] = uVar1;
    auVar51[10] = uVar1;
    auVar51[0xb] = uVar1;
    auVar51[0xc] = uVar1;
    auVar51[0xd] = uVar1;
    auVar51[0xe] = uVar1;
    auVar51[0xf] = uVar1;
    auVar51 = vpminub_avx(auVar7,auVar51);
    auVar6 = vpcmpeqb_avx(auVar7,auVar51);
    auVar47[8] = 0x80;
    auVar47._0_8_ = 0x8080808080808080;
    auVar47[9] = 0x80;
    auVar47[10] = 0x80;
    auVar47[0xb] = 0x80;
    auVar47[0xc] = 0x80;
    auVar47[0xd] = 0x80;
    auVar47[0xe] = 0x80;
    auVar47[0xf] = 0x80;
    auVar51 = vpsubsb_avx(auVar47 ^ auVar3,auVar47 ^ auVar5);
    auVar42 = vpsubsb_avx(auVar47 ^ auVar38,auVar47 ^ auVar4);
    auVar51 = vpandn_avx(auVar6,auVar51);
    auVar51 = vpaddsb_avx(auVar51,auVar42);
    auVar51 = vpaddsb_avx(auVar51,auVar42);
    auVar51 = vpaddsb_avx(auVar51,auVar42);
    auVar49[8] = 4;
    auVar49._0_8_ = 0x404040404040404;
    auVar49[9] = 4;
    auVar49[10] = 4;
    auVar49[0xb] = 4;
    auVar49[0xc] = 4;
    auVar49[0xd] = 4;
    auVar49[0xe] = 4;
    auVar49[0xf] = 4;
    auVar42 = vpand_avx(auVar2,auVar51);
    auVar51 = vpaddsb_avx(auVar49,auVar42);
    auVar41[8] = 3;
    auVar41._0_8_ = 0x303030303030303;
    auVar41[9] = 3;
    auVar41[10] = 3;
    auVar41[0xb] = 3;
    auVar41[0xc] = 3;
    auVar41[0xd] = 3;
    auVar41[0xe] = 3;
    auVar41[0xf] = 3;
    auVar42 = vpaddsb_avx(auVar41,auVar42);
    auVar41 = vpcmpgtb_avx((undefined1  [16])0x0,auVar51);
    auVar51 = vpsrlw_avx(auVar51,3);
    auVar37._8_8_ = 0x1f1f1f1f1f1f1f1f;
    auVar37._0_8_ = 0x1f1f1f1f1f1f1f1f;
    auVar51 = vpand_avx(auVar51,auVar37);
    auVar41 = vpandn_avx(auVar37,auVar41);
    auVar41 = vpor_avx(auVar51,auVar41);
    auVar49 = vpsubsb_avx(auVar47 ^ auVar38,auVar41);
    auVar54._8_8_ = 0x8080808080808080;
    auVar54._0_8_ = 0x8080808080808080;
    auVar49 = auVar49 ^ auVar54;
    auVar38 = vpcmpgtb_avx((undefined1  [16])0x0,auVar42);
    auVar51 = vpsrlw_avx(auVar42,3);
    auVar51 = vpand_avx(auVar51,auVar37);
    auVar38 = vpandn_avx(auVar37,auVar38);
    auVar51 = vpor_avx(auVar51,auVar38);
    auVar51 = vpaddsb_avx(auVar47 ^ auVar4,auVar51);
    auVar52[8] = 1;
    auVar52._0_8_ = 0x101010101010101;
    auVar52[9] = 1;
    auVar52[10] = 1;
    auVar52[0xb] = 1;
    auVar52[0xc] = 1;
    auVar52[0xd] = 1;
    auVar52[0xe] = 1;
    auVar52[0xf] = 1;
    auVar4 = vpaddsb_avx(auVar52,auVar41);
    auVar38 = vpsrlw_avx(auVar4,1);
    auVar42._8_8_ = 0x7f7f7f7f7f7f7f7f;
    auVar42._0_8_ = 0x7f7f7f7f7f7f7f7f;
    auVar38 = vpand_avx(auVar42,auVar38);
    auVar4 = vpandn_avx(auVar42,auVar4);
    auVar4 = vpor_avx(auVar38,auVar4);
    auVar4 = vpand_avx(auVar6,auVar4);
    auVar3 = vpaddsb_avx(auVar47 ^ auVar3,auVar4);
    auVar5 = vpsubsb_avx(auVar47 ^ auVar5,auVar4);
    auVar5 = auVar54 ^ auVar5;
    auVar15 = vpblendd_avx2(auVar30,auVar31,0xf0);
    auVar25 = vpblendd_avx2(auVar34,auVar29,0xf);
    auVar16 = vpblendd_avx2(auVar43,auVar39,0xf);
    auVar12 = vpsubusb_avx2(auVar25,auVar15);
    auVar13 = vpsubusb_avx2(auVar15,auVar25);
    auVar12 = vpor_avx2(auVar12,auVar13);
    auVar13 = vpsubusb_avx2(auVar16,auVar15);
    auVar14 = vpsubusb_avx2(auVar15,auVar16);
    auVar13 = vpor_avx2(auVar14,auVar13);
    auVar12 = vpmaxub_avx2(auVar12,auVar13);
    auVar4 = vpmaxub_avx(auVar7,auVar12._0_16_);
    auVar4 = vpmaxub_avx(auVar4,auVar12._16_16_);
    auVar38 = vpminub_avx(auVar52,auVar4);
    auVar4 = vpcmpeqb_avx(auVar4,auVar38);
    auVar2 = vpand_avx(auVar2,auVar4);
    lVar19 = lVar18 * -2;
    lVar20 = -lVar18;
    if ((((((((((((((((auVar2 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                     (auVar2 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar2 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar2 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar2 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar2 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar2 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar2 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar2 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar2 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar2 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar2 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar2 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
         (auVar2 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar2 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar2[0xf]) {
      *(undefined1 (*) [16])(s + lVar19) = auVar54 ^ auVar3;
      *(undefined1 (*) [16])(s + lVar20) = auVar54 ^ auVar51;
      local_1f8 = auVar49._0_8_;
      uStack_1f0 = auVar49._8_8_;
      *(undefined8 *)s = local_1f8;
      *(undefined8 *)(s + 8) = uStack_1f0;
      *(undefined1 (*) [16])(s + lVar18) = auVar5;
    }
    else {
      auVar24._0_16_ = ZEXT116(0) * auVar5 + ZEXT116(1) * (auVar54 ^ auVar3);
      auVar24._16_16_ = ZEXT116(1) * auVar5;
      auVar44._0_16_ = ZEXT116(0) * auVar49 + ZEXT116(1) * (auVar54 ^ auVar51);
      auVar44._16_16_ = ZEXT116(1) * auVar49;
      auVar12 = vpshufb_avx2(auVar39,_DAT_00511020);
      auVar13 = vpshufb_avx2(auVar29,_DAT_00511020);
      auVar14 = vpshufb_avx2(auVar27,_DAT_00511020);
      auVar8 = vpshufb_avx2(auVar30,_DAT_00511020);
      auVar9 = vpshufb_avx2(auVar31,_DAT_00511020);
      auVar10 = vpshufb_avx2(auVar33,_DAT_00511020);
      auVar11 = vpshufb_avx2(auVar34,_DAT_00511020);
      auVar43 = vpshufb_avx2(auVar43,_DAT_00511020);
      auVar39 = vpaddw_avx2(auVar14,auVar13);
      auVar29 = vpaddw_avx2(auVar8,auVar39);
      auVar39 = vpaddw_avx2(auVar10,auVar9);
      auVar36._8_2_ = 4;
      auVar36._0_8_ = 0x4000400040004;
      auVar36._10_2_ = 4;
      auVar36._12_2_ = 4;
      auVar36._14_2_ = 4;
      auVar36._16_2_ = 4;
      auVar36._18_2_ = 4;
      auVar36._20_2_ = 4;
      auVar36._22_2_ = 4;
      auVar36._24_2_ = 4;
      auVar36._26_2_ = 4;
      auVar36._28_2_ = 4;
      auVar36._30_2_ = 4;
      auVar27 = vpaddw_avx2(auVar39,auVar11);
      auVar39 = vpaddw_avx2(auVar27,auVar36);
      auVar39 = vpaddw_avx2(auVar29,auVar39);
      auVar30 = vpaddw_avx2(auVar12,auVar39);
      auVar31 = vpaddw_avx2(auVar8,auVar30);
      auVar33 = vpsrlw_avx2(auVar31,3);
      auVar31 = vpaddw_avx2(auVar39,auVar43);
      auVar39 = vpaddw_avx2(auVar31,auVar9);
      auVar39 = vpsrlw_avx2(auVar39,3);
      auVar39 = vpackuswb_avx2(auVar33,auVar39);
      auVar39 = vpermq_avx2(auVar39,0xd8);
      auVar40._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar2;
      auVar40._16_16_ = ZEXT116(1) * auVar2;
      auVar33 = vpblendvb_avx2(auVar44,auVar39,auVar40);
      auVar39 = vpsubw_avx2(auVar12,auVar11);
      auVar30 = vpaddw_avx2(auVar30,auVar39);
      auVar39 = vpsubw_avx2(auVar43,auVar13);
      auVar31 = vpaddw_avx2(auVar31,auVar39);
      auVar39 = vpaddw_avx2(auVar14,auVar30);
      auVar34 = vpsrlw_avx2(auVar39,3);
      auVar39 = vpaddw_avx2(auVar10,auVar31);
      auVar39 = vpsrlw_avx2(auVar39,3);
      auVar39 = vpackuswb_avx2(auVar34,auVar39);
      auVar39 = vpermq_avx2(auVar39,0xd8);
      auVar34 = vpblendvb_avx2(auVar24,auVar39,auVar40);
      auVar39 = vpaddw_avx2(auVar12,auVar13);
      auVar39 = vpsubw_avx2(auVar39,auVar10);
      auVar39 = vpaddw_avx2(auVar39,auVar30);
      auVar30 = vpsubw_avx2(auVar11,auVar14);
      auVar30 = vpaddw_avx2(auVar30,auVar43);
      auVar30 = vpaddw_avx2(auVar30,auVar31);
      auVar31 = vpsrlw_avx2(auVar39,3);
      auVar39 = vpsrlw_avx2(auVar30,3);
      auVar39 = vpackuswb_avx2(auVar31,auVar39);
      auVar39 = vpermq_avx2(auVar39,0xd8);
      auVar39 = vpblendvb_avx2(auVar25,auVar39,auVar40);
      auVar51 = *(undefined1 (*) [16])(s + lVar18 * -5);
      auVar22._16_16_ = auVar51;
      auVar22._0_16_ = auVar51;
      auVar3 = *(undefined1 (*) [16])(s + lVar18 * 4);
      auVar45._16_16_ = auVar3;
      auVar45._0_16_ = auVar3;
      auVar4 = *(undefined1 (*) [16])(s + lVar18 * -6);
      auVar32._16_16_ = auVar4;
      auVar32._0_16_ = auVar4;
      auVar38 = *(undefined1 (*) [16])(s + lVar18 * 5);
      auVar35._16_16_ = auVar38;
      auVar35._0_16_ = auVar38;
      auVar23._0_16_ = ZEXT116(0) * auVar3 + ZEXT116(1) * auVar51;
      auVar23._16_16_ = ZEXT116(0) * auVar51 + ZEXT116(1) * auVar3;
      auVar30 = vpsubusb_avx2(auVar23,auVar15);
      auVar31 = vpsubusb_avx2(auVar15,auVar23);
      auVar30 = vpor_avx2(auVar30,auVar31);
      auVar53._0_16_ = ZEXT116(0) * auVar38 + ZEXT116(1) * auVar4;
      auVar53._16_16_ = ZEXT116(0) * auVar4 + ZEXT116(1) * auVar38;
      auVar31 = vpsubusb_avx2(auVar53,auVar15);
      auVar25 = vpsubusb_avx2(auVar15,auVar53);
      auVar31 = vpor_avx2(auVar25,auVar31);
      auVar30 = vpmaxub_avx2(auVar30,auVar31);
      auVar51 = *(undefined1 (*) [16])(s + -(long)(p * 7));
      auVar48._16_16_ = auVar51;
      auVar48._0_16_ = auVar51;
      auVar3 = *(undefined1 (*) [16])(s + lVar18 * 6);
      auVar25._16_16_ = auVar3;
      auVar25._0_16_ = auVar3;
      auVar28._0_16_ = ZEXT116(0) * auVar3 + ZEXT116(1) * auVar51;
      auVar28._16_16_ = ZEXT116(0) * auVar51 + ZEXT116(1) * auVar3;
      auVar31 = vpsubusb_avx2(auVar28,auVar15);
      auVar15 = vpsubusb_avx2(auVar15,auVar28);
      auVar31 = vpor_avx2(auVar31,auVar15);
      auVar30 = vpmaxub_avx2(auVar30,auVar31);
      auVar51 = vpmaxub_avx(auVar30._0_16_,auVar30._16_16_);
      auVar3 = vpminub_avx(auVar51,auVar52);
      auVar51 = vpcmpeqb_avx(auVar51,auVar3);
      auVar2 = vpand_avx(auVar2,auVar51);
      if ((((((((((((((((auVar2 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                       (auVar2 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar2 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar2 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar2 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar2 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar2 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar2 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar2 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar2 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar2 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar2 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar2 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar2 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar2 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar2[0xf]) {
        local_1d8 = auVar39._0_8_;
        uStack_1d0 = auVar39._8_8_;
        uStack_1c8 = auVar39._16_8_;
        uStack_1c0 = auVar39._24_8_;
        *(undefined8 *)(s + lVar18 * -3) = local_1d8;
        *(undefined8 *)(s + lVar18 * -3 + 8) = uStack_1d0;
        local_1f8 = auVar34._0_8_;
        uStack_1f0 = auVar34._8_8_;
        uStack_1e8 = auVar34._16_8_;
        uStack_1e0 = auVar34._24_8_;
        *(undefined8 *)(s + lVar19) = local_1f8;
        *(undefined8 *)(s + lVar19 + 8) = uStack_1f0;
        local_158 = auVar33._0_8_;
        uStack_150 = auVar33._8_8_;
        uStack_148 = auVar33._16_8_;
        uStack_140 = auVar33._24_8_;
        *(undefined8 *)(s + lVar20) = local_158;
        *(undefined8 *)(s + lVar20 + 8) = uStack_150;
        *(undefined8 *)(s + 0x10) = uStack_148;
        *(undefined8 *)(s + 0x18) = uStack_140;
        *(undefined8 *)(s + lVar18 + 0x10) = uStack_1e8;
        *(undefined8 *)(s + lVar18 + 0x18) = uStack_1e0;
        *(undefined8 *)(s + lVar17 + 0x10) = uStack_1c8;
        *(undefined8 *)(s + lVar17 + 0x18) = uStack_1c0;
      }
      else {
        auVar15 = vpshufb_avx2(auVar48,_DAT_00511020);
        auVar24 = vpshufb_avx2(auVar32,_DAT_00511020);
        auVar31 = vpshufb_avx2(auVar22,_DAT_00511020);
        auVar22 = vpshufb_avx2(auVar45,_DAT_00511020);
        auVar28 = vpshufb_avx2(auVar35,_DAT_00511020);
        auVar25 = vpshufb_avx2(auVar25,_DAT_00511020);
        auVar30 = vpaddw_avx2(auVar12,auVar8);
        auVar30 = vpaddw_avx2(auVar30,auVar9);
        auVar29 = vpaddw_avx2(auVar30,auVar29);
        auVar27 = vpaddw_avx2(auVar43,auVar27);
        auVar27 = vpaddw_avx2(auVar27,auVar31);
        auVar27 = vpaddw_avx2(auVar27,auVar22);
        auVar29 = vpaddw_avx2(auVar29,auVar27);
        auVar26._8_2_ = 8;
        auVar26._0_8_ = 0x8000800080008;
        auVar26._10_2_ = 8;
        auVar26._12_2_ = 8;
        auVar26._14_2_ = 8;
        auVar26._16_2_ = 8;
        auVar26._18_2_ = 8;
        auVar26._20_2_ = 8;
        auVar26._22_2_ = 8;
        auVar26._24_2_ = 8;
        auVar26._26_2_ = 8;
        auVar26._28_2_ = 8;
        auVar26._30_2_ = 8;
        auVar27 = vpaddw_avx2(auVar24,auVar28);
        auVar27 = vpaddw_avx2(auVar27,auVar26);
        auVar29 = vpaddw_avx2(auVar29,auVar27);
        auVar27 = vpaddw_avx2(auVar15,auVar14);
        auVar27 = vpaddw_avx2(auVar27,auVar29);
        auVar30 = vpaddw_avx2(auVar25,auVar10);
        auVar30 = vpaddw_avx2(auVar30,auVar29);
        auVar29 = vpsrlw_avx2(auVar27,4);
        auVar36 = vpsrlw_avx2(auVar30,4);
        auVar29 = vpackuswb_avx2(auVar29,auVar36);
        auVar29 = vpermq_avx2(auVar29,0xd8);
        auVar51 = vpblendvb_avx(auVar33._0_16_,auVar29._0_16_,auVar2);
        auVar3 = vpblendvb_avx(auVar33._16_16_,auVar29._16_16_,auVar2);
        auVar29 = vpaddw_avx2(auVar28,auVar9);
        auVar29 = vpsubw_avx2(auVar13,auVar29);
        auVar29 = vpaddw_avx2(auVar15,auVar29);
        auVar27 = vpaddw_avx2(auVar29,auVar27);
        auVar29 = vpaddw_avx2(auVar24,auVar8);
        auVar29 = vpsubw_avx2(auVar11,auVar29);
        auVar29 = vpaddw_avx2(auVar25,auVar29);
        auVar30 = vpaddw_avx2(auVar29,auVar30);
        auVar29 = vpsrlw_avx2(auVar27,4);
        auVar33 = vpsrlw_avx2(auVar30,4);
        auVar29 = vpackuswb_avx2(auVar29,auVar33);
        auVar29 = vpermq_avx2(auVar29,0xd8);
        auVar4 = vpblendvb_avx(auVar34._0_16_,auVar29._0_16_,auVar2);
        auVar38 = vpblendvb_avx(auVar34._16_16_,auVar29._16_16_,auVar2);
        auVar29 = vpaddw_avx2(auVar22,auVar8);
        auVar29 = vpsubw_avx2(auVar12,auVar29);
        auVar29 = vpaddw_avx2(auVar15,auVar29);
        auVar27 = vpaddw_avx2(auVar29,auVar27);
        auVar29 = vpaddw_avx2(auVar31,auVar9);
        auVar29 = vpsubw_avx2(auVar43,auVar29);
        auVar29 = vpaddw_avx2(auVar25,auVar29);
        auVar30 = vpaddw_avx2(auVar29,auVar30);
        auVar29 = vpsrlw_avx2(auVar27,4);
        auVar33 = vpsrlw_avx2(auVar30,4);
        auVar29 = vpackuswb_avx2(auVar29,auVar33);
        auVar29 = vpermq_avx2(auVar29,0xd8);
        auVar5 = vpblendvb_avx(auVar39._0_16_,auVar29._0_16_,auVar2);
        auVar42 = vpblendvb_avx(auVar39._16_16_,auVar29._16_16_,auVar2);
        auVar29 = vpaddw_avx2(auVar43,auVar14);
        auVar39 = vpsubw_avx2(auVar31,auVar29);
        auVar39 = vpaddw_avx2(auVar15,auVar39);
        auVar27 = vpaddw_avx2(auVar39,auVar27);
        auVar31 = vpaddw_avx2(auVar12,auVar10);
        auVar39 = vpsubw_avx2(auVar22,auVar31);
        auVar39 = vpaddw_avx2(auVar25,auVar39);
        auVar30 = vpaddw_avx2(auVar39,auVar30);
        auVar39 = vpsrlw_avx2(auVar27,4);
        auVar33 = vpsrlw_avx2(auVar30,4);
        auVar39 = vpackuswb_avx2(auVar39,auVar33);
        auVar39 = vpermq_avx2(auVar39,0xd8);
        auVar41 = vpblendvb_avx(auVar16._0_16_,auVar39._0_16_,auVar2);
        auVar6 = vpblendvb_avx(auVar16._16_16_,auVar39._16_16_,auVar2);
        auVar39 = vpaddw_avx2(auVar11,auVar13);
        auVar33 = vpsubw_avx2(auVar24,auVar39);
        auVar33 = vpaddw_avx2(auVar33,auVar15);
        auVar27 = vpaddw_avx2(auVar33,auVar27);
        auVar39 = vpsubw_avx2(auVar28,auVar39);
        auVar39 = vpaddw_avx2(auVar25,auVar39);
        auVar30 = vpaddw_avx2(auVar39,auVar30);
        auVar39 = vpsrlw_avx2(auVar27,4);
        auVar33 = vpsrlw_avx2(auVar30,4);
        auVar39 = vpackuswb_avx2(auVar39,auVar33);
        auVar39 = vpermq_avx2(auVar39,0xd8);
        auVar49 = vpblendvb_avx(auVar23._0_16_,auVar39._0_16_,auVar2);
        auVar7 = vpblendvb_avx(auVar23._16_16_,auVar39._16_16_,auVar2);
        auVar39 = vpaddw_avx2(auVar15,auVar15);
        auVar39 = vpsubw_avx2(auVar39,auVar31);
        auVar39 = vpaddw_avx2(auVar27,auVar39);
        auVar27 = vpaddw_avx2(auVar25,auVar25);
        auVar29 = vpsubw_avx2(auVar27,auVar29);
        auVar29 = vpaddw_avx2(auVar29,auVar30);
        auVar39 = vpsrlw_avx2(auVar39,4);
        auVar29 = vpsrlw_avx2(auVar29,4);
        auVar39 = vpackuswb_avx2(auVar39,auVar29);
        auVar39 = vpermq_avx2(auVar39,0xd8);
        auVar50 = vpblendvb_avx(auVar53._0_16_,auVar39._0_16_,auVar2);
        auVar2 = vpblendvb_avx(auVar53._16_16_,auVar39._16_16_,auVar2);
        local_208 = auVar51._0_8_;
        uStack_200 = auVar51._8_8_;
        *(undefined8 *)(s + lVar20) = local_208;
        *(undefined8 *)(s + lVar20 + 8) = uStack_200;
        local_158 = auVar3._0_8_;
        uStack_150 = auVar3._8_8_;
        *(undefined8 *)s = local_158;
        *(undefined8 *)(s + 8) = uStack_150;
        local_138 = auVar4._0_8_;
        uStack_130 = auVar4._8_8_;
        *(undefined8 *)(s + lVar19) = local_138;
        *(undefined8 *)(s + lVar19 + 8) = uStack_130;
        local_1f8 = auVar38._0_8_;
        uStack_1f0 = auVar38._8_8_;
        *(undefined8 *)(s + lVar18) = local_1f8;
        *(undefined8 *)(s + lVar18 + 8) = uStack_1f0;
        local_118 = auVar5._0_8_;
        uStack_110 = auVar5._8_8_;
        *(undefined8 *)(s + lVar18 * -3) = local_118;
        *(undefined8 *)(s + lVar18 * -3 + 8) = uStack_110;
        *(undefined1 (*) [16])(s + lVar17) = auVar42;
        *(undefined1 (*) [16])(s + lVar18 * -4) = auVar41;
        *(undefined1 (*) [16])(s + lVar18 * 3) = auVar6;
        *(undefined1 (*) [16])(s + lVar18 * -5) = auVar49;
        *(undefined1 (*) [16])(s + lVar18 * 4) = auVar7;
        *(undefined1 (*) [16])(s + lVar18 * -6) = auVar50;
        *(undefined1 (*) [16])(s + lVar18 * 5) = auVar2;
      }
    }
  }
  return;
}

Assistant:

void aom_lpf_horizontal_14_quad_avx2(unsigned char *s, int p,
                                     const unsigned char *_blimit0,
                                     const unsigned char *_limit0,
                                     const unsigned char *_thresh0) {
  __m128i mask, flat;
  const __m128i zero = _mm_setzero_si128();
  const __m128i ff = _mm_cmpeq_epi8(zero, zero);

  __m256i p256_3 =
      _mm256_castpd_si256(_mm256_broadcast_pd((__m128d const *)(s - 4 * p)));
  __m256i p256_2 =
      _mm256_castpd_si256(_mm256_broadcast_pd((__m128d const *)(s - 3 * p)));
  __m256i p256_1 =
      _mm256_castpd_si256(_mm256_broadcast_pd((__m128d const *)(s - 2 * p)));
  __m256i p256_0 =
      _mm256_castpd_si256(_mm256_broadcast_pd((__m128d const *)(s - 1 * p)));
  __m256i q256_0 =
      _mm256_castpd_si256(_mm256_broadcast_pd((__m128d const *)(s - 0 * p)));
  __m256i q256_1 =
      _mm256_castpd_si256(_mm256_broadcast_pd((__m128d const *)(s + 1 * p)));
  __m256i q256_2 =
      _mm256_castpd_si256(_mm256_broadcast_pd((__m128d const *)(s + 2 * p)));
  __m256i q256_3 =
      _mm256_castpd_si256(_mm256_broadcast_pd((__m128d const *)(s + 3 * p)));

  __m128i p3 = _mm256_castsi256_si128(p256_3);
  __m128i p2 = _mm256_castsi256_si128(p256_2);
  __m128i p1 = _mm256_castsi256_si128(p256_1);
  __m128i p0 = _mm256_castsi256_si128(p256_0);
  __m128i q0 = _mm256_castsi256_si128(q256_0);
  __m128i q1 = _mm256_castsi256_si128(q256_1);
  __m128i q2 = _mm256_castsi256_si128(q256_2);
  __m128i q3 = _mm256_castsi256_si128(q256_3);

  {
    const __m128i limit_v =
        _mm_broadcastb_epi8(_mm_cvtsi32_si128((int)_limit0[0]));
    const __m128i blimit_v =
        _mm_broadcastb_epi8(_mm_cvtsi32_si128((int)_blimit0[0]));
    const __m128i fe = _mm_set1_epi8((int8_t)0xfe);
    const __m128i abs_p1p0 =
        _mm_or_si128(_mm_subs_epu8(p1, p0), _mm_subs_epu8(p0, p1));
    const __m128i abs_q1q0 =
        _mm_or_si128(_mm_subs_epu8(q1, q0), _mm_subs_epu8(q0, q1));
    __m128i abs_p0q0 =
        _mm_or_si128(_mm_subs_epu8(p0, q0), _mm_subs_epu8(q0, p0));
    __m128i abs_p1q1 =
        _mm_or_si128(_mm_subs_epu8(p1, q1), _mm_subs_epu8(q1, p1));

    flat = _mm_max_epu8(abs_p1p0, abs_q1q0);

    abs_p0q0 = _mm_adds_epu8(abs_p0q0, abs_p0q0);
    abs_p1q1 = _mm_srli_epi16(_mm_and_si128(abs_p1q1, fe), 1);
    mask = _mm_subs_epu8(_mm_adds_epu8(abs_p0q0, abs_p1q1), blimit_v);
    mask = _mm_xor_si128(_mm_cmpeq_epi8(mask, zero), ff);
    // mask |= (abs(p0 - q0) * 2 + abs(p1 - q1) / 2  > blimit) * -1;
    mask = _mm_max_epu8(flat, mask);
    // mask |= (abs(p1 - p0) > limit) * -1;
    // mask |= (abs(q1 - q0) > limit) * -1;
    __m128i work = _mm_max_epu8(
        _mm_or_si128(_mm_subs_epu8(p2, p1), _mm_subs_epu8(p1, p2)),
        _mm_or_si128(_mm_subs_epu8(p3, p2), _mm_subs_epu8(p2, p3)));
    mask = _mm_max_epu8(work, mask);
    work = _mm_max_epu8(
        _mm_or_si128(_mm_subs_epu8(q2, q1), _mm_subs_epu8(q1, q2)),
        _mm_or_si128(_mm_subs_epu8(q3, q2), _mm_subs_epu8(q2, q3)));
    mask = _mm_max_epu8(work, mask);
    mask = _mm_subs_epu8(mask, limit_v);
    mask = _mm_cmpeq_epi8(mask, zero);
  }

  if (0xffff == _mm_movemask_epi8(_mm_cmpeq_epi8(mask, zero))) return;

  // loop filter
  {
    const __m128i thresh_v =
        _mm_broadcastb_epi8(_mm_cvtsi32_si128((int)_thresh0[0]));
    const __m128i one = _mm_set1_epi8(1);
    const __m128i t3 = _mm_set1_epi8(3);
    const __m128i t4 = _mm_add_epi8(one, t3);
    const __m128i t80 = _mm_set1_epi8((int8_t)0x80);
    const __m128i te0 = _mm_set1_epi8((int8_t)0xe0);
    const __m128i t1f = _mm_set1_epi8(0x1f);
    const __m128i t7f = _mm_sub_epi8(t80, one);

    __m128i hev = _mm_subs_epu8(flat, thresh_v);
    hev = _mm_xor_si128(_mm_cmpeq_epi8(hev, zero), ff);

    __m128i ps1 = _mm_xor_si128(p1, t80);
    __m128i ps0 = _mm_xor_si128(p0, t80);
    __m128i qs0 = _mm_xor_si128(q0, t80);
    __m128i qs1 = _mm_xor_si128(q1, t80);

    __m128i filt = _mm_and_si128(_mm_subs_epi8(ps1, qs1), hev);
    __m128i work_a = _mm_subs_epi8(qs0, ps0);
    filt = _mm_adds_epi8(filt, work_a);
    filt = _mm_adds_epi8(filt, work_a);
    filt = _mm_adds_epi8(filt, work_a);
    filt = _mm_and_si128(filt, mask);

    __m128i filter1 = _mm_adds_epi8(filt, t4);
    __m128i filter2 = _mm_adds_epi8(filt, t3);

    work_a = _mm_cmpgt_epi8(zero, filter1);
    filter1 = _mm_srli_epi16(filter1, 3);
    work_a = _mm_and_si128(work_a, te0);
    filter1 = _mm_and_si128(filter1, t1f);
    filter1 = _mm_or_si128(filter1, work_a);
    qs0 = _mm_xor_si128(_mm_subs_epi8(qs0, filter1), t80);

    work_a = _mm_cmpgt_epi8(zero, filter2);
    filter2 = _mm_srli_epi16(filter2, 3);
    work_a = _mm_and_si128(work_a, te0);
    filter2 = _mm_and_si128(filter2, t1f);
    filter2 = _mm_or_si128(filter2, work_a);
    ps0 = _mm_xor_si128(_mm_adds_epi8(ps0, filter2), t80);

    filt = _mm_adds_epi8(filter1, one);
    work_a = _mm_cmpgt_epi8(zero, filt);
    filt = _mm_srli_epi16(filt, 1);
    work_a = _mm_and_si128(work_a, t80);
    filt = _mm_and_si128(filt, t7f);
    filt = _mm_or_si128(filt, work_a);
    filt = _mm_andnot_si128(hev, filt);
    ps1 = _mm_xor_si128(_mm_adds_epi8(ps1, filt), t80);
    qs1 = _mm_xor_si128(_mm_subs_epi8(qs1, filt), t80);

    // Derive flat
    __m256i p0q0256 = _mm256_blend_epi32(p256_0, q256_0, 0xf0);
    __m256i p2q2256 = _mm256_blend_epi32(p256_2, q256_2, 0xf0);
    __m256i p3q3256 = _mm256_blend_epi32(p256_3, q256_3, 0xf0);
    const __m256i ps0qs0256 =
        _mm256_insertf128_si256(_mm256_castsi128_si256(ps0), qs0, 0x1);
    const __m256i ps1qs1256 =
        _mm256_insertf128_si256(_mm256_castsi128_si256(ps1), qs1, 0x1);
    const __m256i work01 = _mm256_or_si256(_mm256_subs_epu8(p2q2256, p0q0256),
                                           _mm256_subs_epu8(p0q0256, p2q2256));
    const __m256i work02 = _mm256_or_si256(_mm256_subs_epu8(p3q3256, p0q0256),
                                           _mm256_subs_epu8(p0q0256, p3q3256));
    const __m256i max0_256 = _mm256_max_epu8(work01, work02);
    const __m128i max1_256 =
        _mm_max_epu8(_mm256_castsi256_si128(max0_256),
                     _mm256_extractf128_si256(max0_256, 1));
    flat = _mm_max_epu8(max1_256, flat);
    flat = _mm_subs_epu8(flat, one);
    flat = _mm_cmpeq_epi8(flat, zero);
    flat = _mm_and_si128(flat, mask);

    // ~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~
    // flat and wide flat calculations
    if (0xffff != _mm_movemask_epi8(_mm_cmpeq_epi8(flat, zero))) {
      const __m256i flat256 =
          _mm256_insertf128_si256(_mm256_castsi128_si256(flat), flat, 0x1);
      const __m256i eight = _mm256_set1_epi16(8);
      const __m256i four = _mm256_set1_epi16(4);

      __m256i p256_4 = _mm256_castpd_si256(
          _mm256_broadcast_pd((__m128d const *)(s - 5 * p)));
      __m256i q256_4 = _mm256_castpd_si256(
          _mm256_broadcast_pd((__m128d const *)(s + 4 * p)));
      __m256i p256_5 = _mm256_castpd_si256(
          _mm256_broadcast_pd((__m128d const *)(s - 6 * p)));
      __m256i q256_5 = _mm256_castpd_si256(
          _mm256_broadcast_pd((__m128d const *)(s + 5 * p)));
      __m256i p256_6 = _mm256_castpd_si256(
          _mm256_broadcast_pd((__m128d const *)(s - 7 * p)));
      __m256i q256_6 = _mm256_castpd_si256(
          _mm256_broadcast_pd((__m128d const *)(s + 6 * p)));

      // Derive flat2
      __m256i p4q4256 = _mm256_blend_epi32(p256_4, q256_4, 0xf0);
      __m256i p5q5256 = _mm256_blend_epi32(p256_5, q256_5, 0xf0);
      const __m256i p6q6256 = _mm256_blend_epi32(p256_6, q256_6, 0xf0);
      const __m256i work1 = _mm256_or_si256(_mm256_subs_epu8(p4q4256, p0q0256),
                                            _mm256_subs_epu8(p0q0256, p4q4256));
      const __m256i work2 = _mm256_or_si256(_mm256_subs_epu8(p5q5256, p0q0256),
                                            _mm256_subs_epu8(p0q0256, p5q5256));
      const __m256i work3 = _mm256_or_si256(_mm256_subs_epu8(p6q6256, p0q0256),
                                            _mm256_subs_epu8(p0q0256, p6q6256));
      __m256i flat2_256 = _mm256_max_epu8(work1, work2);
      flat2_256 = _mm256_max_epu8(flat2_256, work3);
      __m128i flat2 = _mm_max_epu8(_mm256_castsi256_si128(flat2_256),
                                   _mm256_extractf128_si256(flat2_256, 1));
      flat2 = _mm_subs_epu8(flat2, one);
      flat2 = _mm_cmpeq_epi8(flat2, zero);
      flat2 = _mm_and_si128(flat2, flat);  // flat2 & flat & mask

      const __m256i filter =
          _mm256_load_si256((__m256i const *)filt_loopfilter_avx2);

      p256_3 = _mm256_shuffle_epi8(p256_3, filter);
      p256_2 = _mm256_shuffle_epi8(p256_2, filter);
      p256_1 = _mm256_shuffle_epi8(p256_1, filter);
      p256_0 = _mm256_shuffle_epi8(p256_0, filter);
      q256_0 = _mm256_shuffle_epi8(q256_0, filter);
      q256_1 = _mm256_shuffle_epi8(q256_1, filter);
      q256_2 = _mm256_shuffle_epi8(q256_2, filter);
      q256_3 = _mm256_shuffle_epi8(q256_3, filter);

      const __m256i p2p1p0 =
          _mm256_add_epi16(p256_0, _mm256_add_epi16(p256_2, p256_1));
      const __m256i q2q1q0 =
          _mm256_add_epi16(q256_0, _mm256_add_epi16(q256_2, q256_1));

      __m256i pixetFilter_p2p1p0 =
          _mm256_add_epi16(four, _mm256_add_epi16(p2p1p0, q2q1q0));
      __m256i pixetFilter_q2q1q0 = pixetFilter_p2p1p0;

      // Derive p0 and q0
      pixetFilter_p2p1p0 = _mm256_add_epi16(pixetFilter_p2p1p0, p256_3);
      __m256i res_p =
          _mm256_srli_epi16(_mm256_add_epi16(pixetFilter_p2p1p0, p256_0), 3);
      pixetFilter_q2q1q0 = _mm256_add_epi16(pixetFilter_q2q1q0, q256_3);
      __m256i res_q =
          _mm256_srli_epi16(_mm256_add_epi16(pixetFilter_q2q1q0, q256_0), 3);
      __m256i flat_p0q0 =
          _mm256_permute4x64_epi64(_mm256_packus_epi16(res_p, res_q), 0xd8);
      p0q0256 = _mm256_andnot_si256(flat256, ps0qs0256);
      flat_p0q0 = _mm256_and_si256(flat256, flat_p0q0);
      p0q0256 = _mm256_or_si256(flat_p0q0, p0q0256);
      p0 = _mm256_castsi256_si128(p0q0256);
      q0 = _mm256_extractf128_si256(p0q0256, 1);

      // Derive p1 and q1
      __m256i sum_p = _mm256_sub_epi16(p256_3, q256_2);
      pixetFilter_p2p1p0 = _mm256_add_epi16(pixetFilter_p2p1p0, sum_p);
      res_p =
          _mm256_srli_epi16(_mm256_add_epi16(pixetFilter_p2p1p0, p256_1), 3);
      __m256i sum_q = _mm256_sub_epi16(q256_3, p256_2);
      pixetFilter_q2q1q0 = _mm256_add_epi16(pixetFilter_q2q1q0, sum_q);
      res_q =
          _mm256_srli_epi16(_mm256_add_epi16(pixetFilter_q2q1q0, q256_1), 3);
      __m256i flat_p1q1 =
          _mm256_permute4x64_epi64(_mm256_packus_epi16(res_p, res_q), 0xd8);
      __m256i p1q1256 = _mm256_andnot_si256(flat256, ps1qs1256);
      flat_p1q1 = _mm256_and_si256(flat256, flat_p1q1);
      p1q1256 = _mm256_or_si256(flat_p1q1, p1q1256);
      p1 = _mm256_castsi256_si128(p1q1256);
      q1 = _mm256_extractf128_si256(p1q1256, 1);

      // Derive p2 and q2
      sum_p = _mm256_sub_epi16(p256_3, q256_1);
      pixetFilter_p2p1p0 = _mm256_add_epi16(pixetFilter_p2p1p0, sum_p);
      res_p =
          _mm256_srli_epi16(_mm256_add_epi16(pixetFilter_p2p1p0, p256_2), 3);
      sum_q = _mm256_sub_epi16(q256_3, p256_1);
      pixetFilter_q2q1q0 = _mm256_add_epi16(pixetFilter_q2q1q0, sum_q);
      res_q =
          _mm256_srli_epi16(_mm256_add_epi16(pixetFilter_q2q1q0, q256_2), 3);
      __m256i flat_p2q2 =
          _mm256_permute4x64_epi64(_mm256_packus_epi16(res_p, res_q), 0xd8);
      p2q2256 = _mm256_andnot_si256(flat256, p2q2256);
      flat_p2q2 = _mm256_and_si256(flat256, flat_p2q2);
      p2q2256 = _mm256_or_si256(flat_p2q2, p2q2256);
      p2 = _mm256_castsi256_si128(p2q2256);
      q2 = _mm256_extractf128_si256(p2q2256, 1);
      if (0xffff != _mm_movemask_epi8(_mm_cmpeq_epi8(flat2, zero))) {
        flat2_256 =
            _mm256_insertf128_si256(_mm256_castsi128_si256(flat2), flat2, 0x1);
        p256_6 = _mm256_shuffle_epi8(p256_6, filter);
        p256_5 = _mm256_shuffle_epi8(p256_5, filter);
        p256_4 = _mm256_shuffle_epi8(p256_4, filter);
        q256_4 = _mm256_shuffle_epi8(q256_4, filter);
        q256_5 = _mm256_shuffle_epi8(q256_5, filter);
        q256_6 = _mm256_shuffle_epi8(q256_6, filter);

        __m256i pixelFilter_p =
            _mm256_add_epi16(p256_5, _mm256_add_epi16(p256_4, p256_3));
        __m256i pixelFilter_q =
            _mm256_add_epi16(q256_5, _mm256_add_epi16(q256_4, q256_3));

        pixelFilter_p = _mm256_add_epi16(pixelFilter_p, p2p1p0);
        pixelFilter_q = _mm256_add_epi16(pixelFilter_q, q2q1q0);

        pixelFilter_p = _mm256_add_epi16(pixelFilter_p, p256_0);
        pixelFilter_q = _mm256_add_epi16(pixelFilter_q, q256_0);
        pixelFilter_p = _mm256_add_epi16(
            eight, _mm256_add_epi16(pixelFilter_p, pixelFilter_q));
        pixelFilter_q = pixelFilter_p;

        // Derive p0 and q0
        pixelFilter_p =
            _mm256_add_epi16(_mm256_add_epi16(p256_6, p256_1), pixelFilter_p);
        res_p = _mm256_srli_epi16(pixelFilter_p, 4);
        pixelFilter_q =
            _mm256_add_epi16(_mm256_add_epi16(q256_6, q256_1), pixelFilter_q);
        res_q = _mm256_srli_epi16(pixelFilter_q, 4);
        __m256i flat2_p0q0 =
            _mm256_permute4x64_epi64(_mm256_packus_epi16(res_p, res_q), 0xd8);
        p0q0256 = _mm256_andnot_si256(flat2_256, p0q0256);
        flat2_p0q0 = _mm256_and_si256(flat2_256, flat2_p0q0);
        p0q0256 = _mm256_or_si256(flat2_p0q0, p0q0256);

        p0 = _mm256_castsi256_si128(p0q0256);
        q0 = _mm256_extractf128_si256(p0q0256, 1);
        _mm_storeu_si128((__m128i *)(s - 1 * p), p0);
        _mm_storeu_si128((__m128i *)(s - 0 * p), q0);

        // Derive p1 and q1
        sum_p = _mm256_add_epi16(_mm256_sub_epi16(p256_6, q256_5),
                                 _mm256_sub_epi16(p256_2, q256_0));
        pixelFilter_p = _mm256_add_epi16(pixelFilter_p, sum_p);
        res_p = _mm256_srli_epi16(pixelFilter_p, 4);
        sum_q = _mm256_add_epi16(_mm256_sub_epi16(q256_6, p256_5),
                                 _mm256_sub_epi16(q256_2, p256_0));
        pixelFilter_q = _mm256_add_epi16(pixelFilter_q, sum_q);
        res_q = _mm256_srli_epi16(pixelFilter_q, 4);
        __m256i flat2_p1q1 =
            _mm256_permute4x64_epi64(_mm256_packus_epi16(res_p, res_q), 0xd8);
        p1q1256 = _mm256_andnot_si256(flat2_256, p1q1256);
        flat2_p1q1 = _mm256_and_si256(flat2_256, flat2_p1q1);
        p1q1256 = _mm256_or_si256(flat2_p1q1, p1q1256);
        p1 = _mm256_castsi256_si128(p1q1256);
        q1 = _mm256_extractf128_si256(p1q1256, 1);
        _mm_storeu_si128((__m128i *)(s - 2 * p), p1);
        _mm_storeu_si128((__m128i *)(s + 1 * p), q1);

        // Derive p2 and q2
        sum_p = _mm256_add_epi16(_mm256_sub_epi16(p256_6, q256_4),
                                 _mm256_sub_epi16(p256_3, p256_0));
        pixelFilter_p = _mm256_add_epi16(pixelFilter_p, sum_p);
        res_p = _mm256_srli_epi16(pixelFilter_p, 4);
        sum_q = _mm256_add_epi16(_mm256_sub_epi16(q256_6, p256_4),
                                 _mm256_sub_epi16(q256_3, q256_0));
        pixelFilter_q = _mm256_add_epi16(pixelFilter_q, sum_q);
        res_q = _mm256_srli_epi16(pixelFilter_q, 4);
        __m256i flat2_p2q2 =
            _mm256_permute4x64_epi64(_mm256_packus_epi16(res_p, res_q), 0xd8);
        p2q2256 = _mm256_andnot_si256(flat2_256, p2q2256);
        flat2_p2q2 = _mm256_and_si256(flat2_256, flat2_p2q2);
        p2q2256 = _mm256_or_si256(flat2_p2q2, p2q2256);
        p2 = _mm256_castsi256_si128(p2q2256);
        q2 = _mm256_extractf128_si256(p2q2256, 1);
        _mm_storeu_si128((__m128i *)(s - 3 * p), p2);
        _mm_storeu_si128((__m128i *)(s + 2 * p), q2);

        // Derive p3 and q3
        sum_p = _mm256_add_epi16(_mm256_sub_epi16(p256_6, q256_3),
                                 _mm256_sub_epi16(p256_4, p256_1));
        pixelFilter_p = _mm256_add_epi16(pixelFilter_p, sum_p);
        res_p = _mm256_srli_epi16(pixelFilter_p, 4);
        sum_q = _mm256_add_epi16(_mm256_sub_epi16(q256_6, p256_3),
                                 _mm256_sub_epi16(q256_4, q256_1));
        pixelFilter_q = _mm256_add_epi16(pixelFilter_q, sum_q);
        res_q = _mm256_srli_epi16(pixelFilter_q, 4);
        __m256i flat2_p3q3 =
            _mm256_permute4x64_epi64(_mm256_packus_epi16(res_p, res_q), 0xd8);
        p3q3256 = _mm256_andnot_si256(flat2_256, p3q3256);
        flat2_p3q3 = _mm256_and_si256(flat2_256, flat2_p3q3);
        p3q3256 = _mm256_or_si256(flat2_p3q3, p3q3256);
        p3 = _mm256_castsi256_si128(p3q3256);
        q3 = _mm256_extractf128_si256(p3q3256, 1);
        _mm_storeu_si128((__m128i *)(s - 4 * p), p3);
        _mm_storeu_si128((__m128i *)(s + 3 * p), q3);

        // Derive p4 and q4
        sum_p = _mm256_add_epi16(_mm256_sub_epi16(p256_6, q256_2),
                                 _mm256_sub_epi16(p256_5, p256_2));
        pixelFilter_p = _mm256_add_epi16(pixelFilter_p, sum_p);
        res_p = _mm256_srli_epi16(pixelFilter_p, 4);
        sum_q = _mm256_add_epi16(_mm256_sub_epi16(q256_6, p256_2),
                                 _mm256_sub_epi16(q256_5, q256_2));
        pixelFilter_q = _mm256_add_epi16(pixelFilter_q, sum_q);
        res_q = _mm256_srli_epi16(pixelFilter_q, 4);
        __m256i flat2_p4q4 =
            _mm256_permute4x64_epi64(_mm256_packus_epi16(res_p, res_q), 0xd8);
        p4q4256 = _mm256_andnot_si256(flat2_256, p4q4256);
        flat2_p4q4 = _mm256_and_si256(flat2_256, flat2_p4q4);
        p4q4256 = _mm256_or_si256(flat2_p4q4, p4q4256);
        _mm_storeu_si128((__m128i *)(s - 5 * p),
                         _mm256_castsi256_si128(p4q4256));
        _mm_storeu_si128((__m128i *)(s + 4 * p),
                         _mm256_extractf128_si256(p4q4256, 1));

        // Derive p5 and q5
        sum_p = _mm256_add_epi16(_mm256_sub_epi16(p256_6, q256_1),
                                 _mm256_sub_epi16(p256_6, p256_3));
        pixelFilter_p = _mm256_add_epi16(pixelFilter_p, sum_p);
        res_p = _mm256_srli_epi16(pixelFilter_p, 4);
        sum_q = _mm256_add_epi16(_mm256_sub_epi16(q256_6, p256_1),
                                 _mm256_sub_epi16(q256_6, q256_3));
        pixelFilter_q = _mm256_add_epi16(pixelFilter_q, sum_q);
        res_q = _mm256_srli_epi16(pixelFilter_q, 4);
        __m256i flat2_p5q5 =
            _mm256_permute4x64_epi64(_mm256_packus_epi16(res_p, res_q), 0xd8);
        p5q5256 = _mm256_andnot_si256(flat2_256, p5q5256);
        flat2_p5q5 = _mm256_and_si256(flat2_256, flat2_p5q5);
        p5q5256 = _mm256_or_si256(flat2_p5q5, p5q5256);
        _mm_storeu_si128((__m128i *)(s - 6 * p),
                         _mm256_castsi256_si128(p5q5256));
        _mm_storeu_si128((__m128i *)(s + 5 * p),
                         _mm256_extractf128_si256(p5q5256, 1));
      } else {
        _mm_storeu_si128((__m128i *)(s - 3 * p), p2);
        _mm_storeu_si128((__m128i *)(s - 2 * p), p1);
        _mm_storeu_si128((__m128i *)(s - 1 * p), p0);
        _mm_storeu_si128((__m128i *)(s - 0 * p), q0);
        _mm_storeu_si128((__m128i *)(s + 1 * p), q1);
        _mm_storeu_si128((__m128i *)(s + 2 * p), q2);
      }
    } else {
      _mm_storeu_si128((__m128i *)(s - 2 * p), ps1);
      _mm_storeu_si128((__m128i *)(s - 1 * p), ps0);
      _mm_storeu_si128((__m128i *)(s - 0 * p), qs0);
      _mm_storeu_si128((__m128i *)(s + 1 * p), qs1);
    }
  }
}